

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void rw::cameraSync(ObjectWithFrame *obj)

{
  void **dst;
  Matrix *pMVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Matrix proj;
  Matrix inv;
  Matrix local_98;
  Matrix local_58;
  
  pMVar1 = Frame::getLTM((Frame *)(obj->object).parent);
  Matrix::invertOrthonormal(&local_58,pMVar1);
  local_58.right.x = (float32)-(float)local_58.right.x;
  local_58.up.x = (float32)-(float)local_58.up.x;
  local_58.at.x = (float32)-(float)local_58.at.x;
  local_58.pos.x = (float32)-(float)local_58.pos.x;
  fVar3 = *(float *)&obj[1].inFrame.next;
  fVar5 = *(float *)((long)&obj[1].inFrame.next + 4);
  local_98.right.x = (float32)(1.0 / (fVar3 + fVar3));
  local_98.pos.y = (float32)(1.0 / (fVar5 + fVar5));
  local_98.right.y = 0.0;
  local_98.right.z = 0.0;
  local_98.flags = 0;
  local_98.up.x = 0.0;
  local_98.up.y = (float32)-(float)local_98.pos.y;
  local_98.up.z = 0.0;
  dst = &obj[2].object.parent;
  local_98.at.x = *(float32 *)&obj[1].inFrame.prev;
  if (*(int *)&obj[2].object.field_0x4 == 1) {
    local_98.pos.x = (float32)((float)local_98.right.x * -(float)local_98.at.x);
    local_98.pos.y = (float32)((float)local_98.pos.y * *(float *)((long)&obj[1].inFrame.prev + 4));
    local_98.pos.z = 0.0;
    local_98.at.x = (float32)(0.5 - (float)local_98.pos.x);
    local_98.at.y = (float32)(0.5 - (float)local_98.pos.y);
    local_98.at.z = 1.0;
    Matrix::optimize(&local_98,(Tolerance *)0x0);
    Matrix::mult((Matrix *)dst,&local_58,&local_98);
    pMVar1 = Frame::getLTM((Frame *)(obj->object).parent);
    fVar3 = *(float *)&obj[1].inFrame.next;
    fVar5 = *(float *)((long)&obj[1].inFrame.next + 4);
    fVar7 = (float)(pMVar1->up).x * fVar5;
    fVar8 = (float)(pMVar1->up).y * fVar5;
    fVar5 = fVar5 * (float)(pMVar1->up).z;
    fVar9 = (float)(pMVar1->right).x * fVar3;
    fVar10 = (float)(pMVar1->right).y * fVar3;
    fVar3 = fVar3 * (float)(pMVar1->right).z;
    fVar4 = (float)(pMVar1->at).y;
    fVar6 = (float)(pMVar1->at).z;
    fVar11 = (float)(pMVar1->at).x + fVar7 + fVar9;
    obj[7].object.type = SUB41(fVar11,0);
    obj[7].object.subType = (char)((uint)fVar11 >> 8);
    obj[7].object.flags = (char)((uint)fVar11 >> 0x10);
    obj[7].object.privateFlags = (char)((uint)fVar11 >> 0x18);
    *(float *)&obj[7].object.field_0x4 = fVar4 + fVar8 + fVar10;
    *(float *)&obj[7].object.parent = fVar6 + fVar5 + fVar3;
    fVar4 = (float)(pMVar1->at).z;
    *(ulong *)((long)&obj[7].object.parent + 4) =
         CONCAT44(((float)(pMVar1->at).y + fVar8) - fVar10,((float)(pMVar1->at).x + fVar7) - fVar9);
    *(float *)((long)&obj[7].inFrame.next + 4) = (fVar4 + fVar5) - fVar3;
    fVar4 = (float)(pMVar1->at).z;
    obj[7].inFrame.prev =
         (LLLink *)
         CONCAT44(((float)(pMVar1->at).y - fVar8) - fVar10,((float)(pMVar1->at).x - fVar7) - fVar9);
    *(float *)&obj[7].syncCB = (fVar4 - fVar5) - fVar3;
    fVar4 = (float)(pMVar1->at).z;
    *(ulong *)((long)&obj[7].syncCB + 4) =
         CONCAT44(((float)(pMVar1->at).y - fVar8) + fVar10,((float)(pMVar1->at).x - fVar7) + fVar9);
    *(float *)&obj[8].object.field_0x4 = (fVar4 - fVar5) + fVar3;
    fVar3 = *(float *)&obj[1].inFrame.prev;
    fVar5 = *(float *)((long)&obj[1].inFrame.prev + 4);
    fVar6 = (float)(pMVar1->up).x * fVar5 - (float)(pMVar1->right).x * fVar3;
    fVar7 = (float)(pMVar1->up).y * fVar5 - (float)(pMVar1->right).y * fVar3;
    fVar4 = fVar5 * (float)(pMVar1->up).z - fVar3 * (float)(pMVar1->right).z;
    fVar3 = *(float *)&obj[1].syncCB;
    fVar5 = *(float *)((long)&obj[1].syncCB + 4);
    lVar2 = 0x118;
    do {
      fVar8 = *(float *)(&(obj->object).type + lVar2) - fVar6;
      fVar9 = *(float *)(&(obj->object).field_0x4 + lVar2) - fVar7;
      fVar10 = *(float *)((long)&(obj->object).parent + lVar2) - fVar4;
      fVar11 = (float)(pMVar1->pos).x + fVar6;
      fVar12 = (float)(pMVar1->pos).y + fVar7;
      fVar13 = (float)(pMVar1->pos).z + fVar4;
      *(ulong *)(&(obj->object).type + lVar2) =
           CONCAT44(fVar3 * fVar9 + fVar12,fVar3 * fVar8 + fVar11);
      *(float *)((long)&(obj->object).parent + lVar2) = fVar3 * fVar10 + fVar13;
      *(ulong *)((long)&obj[1].object.parent + lVar2) =
           CONCAT44(fVar9 * fVar5 + fVar12,fVar8 * fVar5 + fVar11);
      *(float *)((long)&obj[1].inFrame.next + lVar2) = fVar10 * fVar5 + fVar13;
      lVar2 = lVar2 + 0xc;
    } while (lVar2 != 0x148);
  }
  else {
    local_98.at.x = (float32)((float)local_98.right.x * (float)local_98.at.x);
    local_98.at.y = (float32)((float)local_98.pos.y * -*(float *)((long)&obj[1].inFrame.prev + 4));
    local_98.at.z = 1.0;
    local_98.pos.x = (float32)(0.5 - (float)local_98.at.x);
    local_98.pos.y = (float32)(0.5 - (float)local_98.at.y);
    local_98.pos.z = 0.0;
    Matrix::optimize(&local_98,(Tolerance *)0x0);
    Matrix::mult((Matrix *)dst,&local_58,&local_98);
    pMVar1 = Frame::getLTM((Frame *)(obj->object).parent);
    fVar3 = *(float *)&obj[1].syncCB;
    fVar5 = *(float *)&obj[1].inFrame.prev;
    fVar10 = -(1.0 - fVar3) * fVar5;
    fVar4 = *(float *)((long)&obj[1].inFrame.prev + 4);
    fVar9 = (1.0 - fVar3) * fVar4;
    fVar6 = *(float *)((long)&obj[1].syncCB + 4);
    fVar5 = -(1.0 - fVar6) * fVar5;
    fVar4 = (1.0 - fVar6) * fVar4;
    fVar7 = *(float *)&obj[1].inFrame.next;
    fVar8 = *(float *)((long)&obj[1].inFrame.next + 4);
    fVar11 = fVar10 + fVar7;
    *(float *)&obj[7].object = fVar11;
    fVar12 = fVar9 + fVar8;
    *(float *)&obj[7].object.field_0x4 = fVar12;
    *(float *)&obj[7].object.parent = fVar3;
    fVar10 = fVar10 - fVar7;
    *(float *)((long)&obj[7].object.parent + 4) = fVar10;
    *(float *)&obj[7].inFrame.next = fVar12;
    *(float *)((long)&obj[7].inFrame.next + 4) = fVar3;
    *(float *)&obj[7].inFrame.prev = fVar10;
    fVar9 = fVar9 - fVar8;
    *(float *)((long)&obj[7].inFrame.prev + 4) = fVar9;
    *(float *)&obj[7].syncCB = fVar3;
    *(float *)((long)&obj[7].syncCB + 4) = fVar11;
    *(float *)&obj[8].object = fVar9;
    *(float *)&obj[8].object.field_0x4 = fVar3;
    fVar3 = fVar7 + fVar5;
    *(float *)&obj[8].object.parent = fVar3;
    fVar9 = fVar4 + fVar8;
    *(float *)((long)&obj[8].object.parent + 4) = fVar9;
    *(float *)&obj[8].inFrame.next = fVar6;
    fVar5 = fVar5 - fVar7;
    *(float *)((long)&obj[8].inFrame.next + 4) = fVar5;
    *(float *)&obj[8].inFrame.prev = fVar9;
    *(float *)((long)&obj[8].inFrame.prev + 4) = fVar6;
    *(float *)&obj[8].syncCB = fVar5;
    fVar4 = fVar4 - fVar8;
    *(float *)((long)&obj[8].syncCB + 4) = fVar4;
    *(float *)&obj[9].object = fVar6;
    *(float *)&obj[9].object.field_0x4 = fVar3;
    *(float *)&obj[9].object.parent = fVar4;
    *(float *)((long)&obj[9].object.parent + 4) = fVar6;
    V3d::transformPoints((V3d *)(obj + 7),(V3d *)(obj + 7),8,pMVar1);
  }
  buildPlanes((Camera *)obj);
  BBox::calculate((BBox *)&obj[9].inFrame,(V3d *)(obj + 7),8);
  return;
}

Assistant:

static void
cameraSync(ObjectWithFrame *obj)
{
	/*
	 * RW projection matrix looks like this:
	 *       (cf. Camera View Matrix white paper)
	 * w = viewWindow width
	 * h = viewWindow height
	 * o = view offset
	 *
	 * perspective:
	 * 1/2w       0    ox/2w + 1/2   -ox/2w
	 *    0   -1/2h   -oy/2h + 1/2    oy/2h
	 *    0       0              1        0
	 *    0       0              1        0
	 *
	 * parallel:
	 * 1/2w       0    ox/2w   -ox/2w + 1/2
	 *    0   -1/2h   -oy/2h    oy/2h + 1/2
	 *    0       0        1              0
	 *    0       0        0              1
	 *
	 * The view matrix transforms from world to clip space, it is however
	 * not used for OpenGL or D3D since transformation to camera space
	 * and to clip space are handled by separate matrices there.
	 * On these platforms the two matrices are built in the platform's
	 * beginUpdate function.
	 * On the PS2 the z- and w-rows are the same and the 
	 * 1/2 translation/shear is removed again on the VU1 by
	 * subtracting the w-row/2 from the x- and y-rows.
	 *
	 * perspective:
	 * 1/2w       0    ox/2w   -ox/2w
	 *    0   -1/2h   -oy/2h    oy/2h
	 *    0       0        1        0
	 *    0       0        1        0
	 *
	 * parallel:
	 * 1/2w       0    ox/2w   -ox/2w
	 *    0   -1/2h   -oy/2h    oy/2h
	 *    0       0        1        0
	 *    0       0        0        1
	 *
	 * RW builds this matrix directly without using explicit
	 * inversion and matrix multiplication.
	 */

	Camera *cam = (Camera*)obj;
	Matrix inv, proj;
	Matrix::invertOrthonormal(&inv, cam->getFrame()->getLTM());

	inv.right.x = -inv.right.x;
	inv.up.x = -inv.up.x;
	inv.at.x = -inv.at.x;
	inv.pos.x = -inv.pos.x;

	float32 xscl = 1.0f/(2.0f*cam->viewWindow.x);
	float32 yscl = 1.0f/(2.0f*cam->viewWindow.y);

	proj.flags = 0;
	proj.right.x = xscl;
	proj.right.y = 0.0f;
	proj.right.z = 0.0f;

	proj.up.x = 0.0f;
	proj.up.y = -yscl;
	proj.up.z = 0.0f;

	if(cam->projection == Camera::PERSPECTIVE){
		proj.pos.x = -cam->viewOffset.x*xscl;
		proj.pos.y = cam->viewOffset.y*yscl;
		proj.pos.z = 0.0f;

		proj.at.x = -proj.pos.x + 0.5f;
		proj.at.y = -proj.pos.y + 0.5f;
		proj.at.z = 1.0f;
		proj.optimize();
		Matrix::mult(&cam->viewMatrix, &inv, &proj);
		buildClipPersp(cam);
	}else{
		proj.at.x = cam->viewOffset.x*xscl;
		proj.at.y = -cam->viewOffset.y*yscl;
		proj.at.z = 1.0f;

		proj.pos.x = -proj.at.x + 0.5f;
		proj.pos.y = -proj.at.y + 0.5f;
		proj.pos.z = 0.0f;
		proj.optimize();
		Matrix::mult(&cam->viewMatrix, &inv, &proj);
		buildClipParallel(cam);
	}
	cam->frustumBoundBox.calculate(cam->frustumCorners, 8);
}